

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ResultBuilder * __thiscall
Catch::ExpressionLhs<char_const&>::captureExpression<(Catch::Internal::Operator)0,char>
          (ExpressionLhs<char_const&> *this,char *rhs)

{
  ResultBuilder *pRVar1;
  string local_78 [7];
  char value;
  char local_68 [16];
  string local_58;
  string local_38;
  
  value = (char)((ulong)_local_78 >> 0x38);
  pRVar1 = ResultBuilder::setResultType(*(ResultBuilder **)this,**(char **)(this + 8) == *rhs);
  Catch::toString_abi_cxx11_(value);
  pRVar1 = ResultBuilder::setLhs(pRVar1,&local_38);
  Catch::toString_abi_cxx11_(value);
  pRVar1 = ResultBuilder::setRhs(pRVar1,&local_58);
  _local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>(local_78,"==","");
  pRVar1 = ResultBuilder::setOp(pRVar1,(string *)local_78);
  if (_local_78 != local_68) {
    operator_delete(_local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }